

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O0

void __thiscall
DestListEntryArray::fillDestListEntryArray
          (DestListEntryArray *this,ReadStream *rs,int readFrom,DestListHeader *header)

{
  pointer *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> bVar5;
  iterator __first;
  iterator __last;
  iterator __first_00;
  iterator __last_00;
  int local_3f4;
  undefined1 local_3d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> entryStringData;
  int len;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  iterator it;
  undefined1 local_1b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> firstPartOfEntry;
  DestListEntry tmpDestListEntry;
  int tmpReadFrom;
  int count;
  DestListHeader *header_local;
  int readFrom_local;
  ReadStream *rs_local;
  DestListEntryArray *this_local;
  
  tmpDestListEntry.EntryStringData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       DestListHeader::getTotalNumberOfCurrentEntries(header);
  tmpDestListEntry.EntryStringData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = readFrom;
  do {
    if ((int)tmpDestListEntry.EntryStringData.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
      return;
    }
    DestListEntry::DestListEntry
              ((DestListEntry *)
               &firstPartOfEntry.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ReadStream::read((ReadStream *)local_1b0,(int)rs,
                     (void *)(ulong)(uint)tmpDestListEntry.EntryStringData.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0x82);
    tmpDestListEntry.EntryStringData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)tmpDestListEntry.EntryStringData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x82;
    local_1c8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
    _Var1._M_current = local_1c8._M_current;
    if (sVar3 == 0) {
      local_3f4 = 3;
    }
    else {
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,8);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &firstPartOfEntry.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,8);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,0x10);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.Checksum.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,0x10);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,0x10);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.VolumeId.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,0x10);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,0x10);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.ObjectId.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,0x10);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,0x10);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.BirthVolumeId.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,0x10);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,0x10);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.BirthObjectId.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,0x10);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,4);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.NetBIOSName.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      tmpDestListEntry.EntryStringData.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)tmpDestListEntry.EntryStringData.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,4);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,8);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.EntryId.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,8);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,8);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.Reserved1.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,8);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,4);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.MSFileTime.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,4);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,4);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.EntryPinStatus.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,4);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,4);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.Reserved2.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,4);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,8);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.AccessedCount.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_1c8,8);
      _Var1._M_current = local_1c8._M_current;
      _Var4 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1c8,2);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.Reserved3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Var1,_Var4,bVar5);
      this_00 = &tmpDestListEntry.Reserved3.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
      __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &entryStringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &tmpDestListEntry.Reserved3.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      iVar2 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &entryStringData.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &entryStringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ReadStream::read((ReadStream *)local_3d0,(int)rs,
                       (void *)(ulong)(uint)tmpDestListEntry.EntryStringData.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ulong)(uint)(iVar2 * 2));
      __first_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
      __last_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
      bVar5 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &tmpDestListEntry.LengthOfUnicodeData.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last_00._M_current,bVar5);
      tmpDestListEntry.EntryStringData.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           iVar2 * 2 +
           (uint)tmpDestListEntry.EntryStringData.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      reverseAllFields(this,(DestListEntry *)
                            &firstPartOfEntry.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
      ::push_back(&this->destListEntryArray,
                  (value_type *)
                  &firstPartOfEntry.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      tmpDestListEntry.EntryStringData.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           tmpDestListEntry.EntryStringData.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ - 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
      local_3f4 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
    DestListEntry::~DestListEntry
              ((DestListEntry *)
               &firstPartOfEntry.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  } while (local_3f4 == 0);
  return;
}

Assistant:

void DestListEntryArray::fillDestListEntryArray(ReadStream *rs, int readFrom, DestListHeader header) {
    int count = header.getTotalNumberOfCurrentEntries();
    int tmpReadFrom = readFrom;

    while(count > 0) {
        DestListEntry tmpDestListEntry;

        std::vector<unsigned char> firstPartOfEntry = rs->read(tmpReadFrom,130);
        tmpReadFrom = 130 + tmpReadFrom;
        auto it = firstPartOfEntry.begin();

       if(firstPartOfEntry.size() != 0) {
            std::copy(it, it + 8, std::back_inserter(tmpDestListEntry.Checksum));
            it += 8;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.VolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.ObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.BirthVolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.BirthObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.NetBIOSName));
            it += 16;
            std::copy(it, it + 4, std::back_inserter(tmpDestListEntry.EntryId));
            tmpReadFrom = 4 + tmpReadFrom;
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved1));
            it += 8;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.MSFileTime));
            it += 8;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.EntryPinStatus));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.Reserved2));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.AccessedCount));
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved3));
            it += 8;
            std::copy(it, it + 2, std::back_inserter(tmpDestListEntry.LengthOfUnicodeData));
            reverse(tmpDestListEntry.LengthOfUnicodeData.begin(), tmpDestListEntry.LengthOfUnicodeData.end());
            int len = Utils::lenTwoBytes(tmpDestListEntry.LengthOfUnicodeData);
            len *= 2; // Because it is unicode characters
            std::vector<unsigned char> entryStringData =  rs->read(tmpReadFrom, len);
            std::copy(entryStringData.begin(), entryStringData.end(), std::back_inserter(tmpDestListEntry.EntryStringData));
            tmpReadFrom = len + tmpReadFrom;
            DestListEntryArray::reverseAllFields(&tmpDestListEntry);
            destListEntryArray.push_back(tmpDestListEntry);
            --count;
        } else break;
    }
}